

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O3

int __thiscall
helics::ipc::OwnedQueue::connect(OwnedQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  string *this_00;
  string *this_01;
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  *this_02;
  error_info eVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false> __ptr;
  undefined8 mut_00;
  socklen_t sVar4;
  size_type sVar5;
  int iVar6;
  _Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false> _Var7;
  managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false> *__p_00;
  int *piVar8;
  interprocess_exception *this_03;
  long lVar9;
  size_type sVar10;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  pointer __p;
  size_type __new_size;
  int iVar11;
  pointer __p_1;
  mutex_initializer mut;
  mutexattr_wrapper mut_attr;
  undefined1 local_d0 [17];
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  socklen_t local_b0;
  int local_ac;
  __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  local_a8 [4];
  pthread_mutexattr_t local_88 [8];
  error_info local_68;
  size_type local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  pointer local_48;
  long local_40;
  size_type local_38;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000034,__fd);
  local_ac = (int)__addr;
  local_b0 = __len;
  if ((this->rqueue)._M_t.
      super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      .
      super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
      ._M_head_impl !=
      (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->connectionName)._M_dataplus._M_p);
  }
  if ((this->queue_state)._M_t.
      super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
      .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl !=
      (shared_memory_object *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->stateName)._M_dataplus._M_p);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->connectionNameOrig,__str);
  pcVar2 = (__str->_M_dataplus)._M_p;
  local_68 = (error_info)&local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + __str->_M_string_length);
  sVar5 = local_60;
  eVar1 = local_68;
  if (local_60 != 0) {
    sVar10 = 0;
    do {
      iVar11 = (int)*(char *)((long)eVar1 + sVar10);
      iVar6 = isalnum(iVar11);
      if ((iVar11 != 0x5f) && (iVar6 == 0)) {
        *(undefined1 *)((long)eVar1 + sVar10) = 0x5f;
      }
      sVar10 = sVar10 + 1;
    } while (sVar5 != sVar10);
  }
  eVar1 = (error_info)((long)local_d0 + 0x10);
  local_d0._0_8_ = local_68;
  if (local_68 == (error_info)&local_58) {
    uStack_b8 = uStack_50;
    local_d0._0_8_ = eVar1;
  }
  uStack_bf = uStack_57;
  local_d0[0x10] = local_58;
  local_d0._8_8_ = local_60;
  local_60 = 0;
  local_58 = 0;
  this_00 = &this->connectionName;
  local_68 = (error_info)&local_58;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  if ((error_info)local_d0._0_8_ != eVar1) {
    operator_delete((void *)local_d0._0_8_,stack0xffffffffffffff40 + 1);
  }
  if (local_68 != (error_info)&local_58) {
    operator_delete((void *)local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  pcVar3 = (this->connectionName)._M_dataplus._M_p;
  local_d0._0_8_ = eVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar3,pcVar3 + (this->connectionName)._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,"_state")
  ;
  this_01 = &this->stateName;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  if ((error_info)local_d0._0_8_ != eVar1) {
    operator_delete((void *)local_d0._0_8_,stack0xffffffffffffff40 + 1);
  }
  boost::interprocess::shared_memory_object::remove((this_00->_M_dataplus)._M_p);
  boost::interprocess::shared_memory_object::remove((this_01->_M_dataplus)._M_p);
  pcVar3 = (this_01->_M_dataplus)._M_p;
  _Var7._M_head_impl = (shared_memory_object *)operator_new(0x28);
  local_a8[0]._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl._0_4_ = 0x1a4;
  boost::interprocess::shared_memory_object::shared_memory_object(_Var7._M_head_impl,pcVar3,2);
  this_02 = &this->queue_state;
  local_d0._0_4_ = 0;
  local_d0._4_4_ = no_error;
  __ptr._M_head_impl =
       (this_02->_M_t).
       super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
       ._M_t.
       super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
       .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl;
  (this_02->_M_t).
  super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
  .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
       _Var7._M_head_impl;
  if ((__ptr._M_head_impl != (shared_memory_object *)0x0) &&
     (std::default_delete<boost::interprocess::shared_memory_object>::operator()
                ((default_delete<boost::interprocess::shared_memory_object> *)this_02,
                 __ptr._M_head_impl), (error_info)local_d0._0_8_ != (error_info)0x0)) {
    std::default_delete<boost::interprocess::shared_memory_object>::operator()
              ((default_delete<boost::interprocess::shared_memory_object> *)local_d0,
               (shared_memory_object *)local_d0._0_8_);
  }
  iVar6 = ftruncate(((this_02->_M_t).
                     super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                    _M_head_impl)->m_handle,0x130);
  if (iVar6 == 0) {
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              ((mapped_region *)local_d0,
               (this_02->_M_t).
               super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
               .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
               _M_head_impl,read_write,0,0,(void *)0x0,-1);
    mut_00 = local_d0._0_8_;
    boost::interprocess::ipcdetail::mutexattr_wrapper::mutexattr_wrapper
              ((mutexattr_wrapper *)local_88,false);
    boost::interprocess::ipcdetail::mutex_initializer::mutex_initializer
              ((mutex_initializer *)local_a8,(pthread_mutex_t *)mut_00,local_88);
    pthread_mutexattr_destroy((pthread_mutexattr_t *)local_88);
    (((pthread_mutex_t *)(mut_00 + 0x28))->__data).__lock = 0;
    SharedQueueState::setState((SharedQueueState *)mut_00,startup);
    pcVar3 = (this_00->_M_dataplus)._M_p;
    __p_00 = (managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>
              *)operator_new(0x20);
    sVar4 = local_b0;
    local_88[0].__align = 0x1a4;
    __new_size = (size_type)(int)local_b0;
    local_40 = (long)local_ac;
    local_48 = pcVar3;
    local_38 = __new_size;
    boost::interprocess::ipcdetail::
    managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>::
    managed_open_or_create_impl<boost::interprocess::ipcdetail::msg_queue_initialization_func_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>>
              (__p_00,&local_48,((__new_size - 1 & 0xfffffffffffffff8) + 0x20) * local_40 + 0xd0,2,0
               ,&local_40,(pthread_mutexattr_t *)local_88);
    local_a8[0]._M_t.
    super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
    .
    super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
    ._M_head_impl =
         (tuple<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )(_Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
    ::reset((__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
             *)this,(pointer)__p_00);
    std::
    unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
    ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                   *)local_a8);
    SharedQueueState::setState((SharedQueueState *)mut_00,connected);
    this->mxSize = sVar4;
    std::vector<char,_std::allocator<char>_>::resize(&this->buffer,__new_size);
    this->connected = true;
    if ((error_info)local_d0._0_8_ != (error_info)0x0) {
      if (uStack_b8._4_1_ == '\x01') {
        shmdt((void *)local_d0._0_8_);
      }
      else {
        munmap((void *)(local_d0._0_8_ - stack0xffffffffffffff40),
               stack0xffffffffffffff40 + local_d0._8_8_);
      }
    }
    return (int)CONCAT71((int7)((ulong)this >> 8),1);
  }
  piVar8 = __errno_location();
  lVar9 = 0;
  do {
    if (*(int *)((long)&boost::interprocess::ec_table + lVar9) == *piVar8) {
      local_d0._4_4_ = *(undefined4 *)(&UNK_0041f334 + lVar9);
      goto LAB_002b58cc;
    }
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x80);
  local_d0._4_4_ = system_error;
LAB_002b58cc:
  local_d0._0_4_ = *piVar8;
  this_03 = (interprocess_exception *)__cxa_allocate_exception(0x30);
  boost::interprocess::interprocess_exception::interprocess_exception
            (this_03,(error_info *)local_d0,(char *)0x0);
  __cxa_throw(this_03,&boost::interprocess::interprocess_exception::typeinfo,
              boost::interprocess::interprocess_exception::~interprocess_exception);
}

Assistant:

bool OwnedQueue::connect(const std::string& connection, int maxMessages, int maxSize)
    {
        // remove the old queue if are connecting again
        if (rqueue) {
            ipc_queue::remove(connectionName.c_str());
        }
        if (queue_state) {
            ipc_state::remove(stateName.c_str());
        }
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        stateName = connectionName + "_state";
        ipc_queue::remove(connectionName.c_str());

        ipc_state::remove(stateName.c_str());

        try {
            queue_state = std::make_unique<ipc_state>(boostipc::create_only,
                                                      stateName.c_str(),
                                                      boostipc::read_write);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local state shared memory:") + ipe.what();
            return false;
        }
        queue_state->truncate(sizeof(SharedQueueState) + 256);
        // Map the whole shared memory in this process
        boostipc::mapped_region region(*queue_state, boostipc::read_write);

        auto* sstate = new (region.get_address()) SharedQueueState;
        sstate->setState(queue_state_t::startup);

        try {
            rqueue = std::make_unique<ipc_queue>(boostipc::create_only,
                                                 connectionName.c_str(),
                                                 maxMessages,
                                                 maxSize);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local connection:") + ipe.what();
            return false;
        }
        sstate->setState(queue_state_t::connected);
        mxSize = maxSize;
        buffer.resize(maxSize);
        connected = true;
        return true;
    }